

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_ul_setup(connectdata *conn,_Bool sizechecked)

{
  undefined1 *puVar1;
  Curl_easy *data;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  long lVar11;
  
  data = conn->data;
  lVar9 = (data->state).resume_from;
  bVar3 = lVar9 != 0;
  if ((int)CONCAT71(in_register_00000031,sizechecked) != 0) {
    bVar3 = 0 < lVar9;
  }
  if (!bVar3) goto LAB_00506080;
  if (lVar9 < 0) {
    bVar3 = false;
    CVar5 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"SIZE %s",(conn->proto).ftpc.file);
    if (CVar5 == CURLE_OK) {
      (conn->proto).ftpc.state = FTP_STOR_SIZE;
      goto LAB_00506056;
    }
  }
  else {
    pvVar2 = (data->req).protop;
    puVar1 = &(data->set).field_0x879;
    *puVar1 = *puVar1 | 0x10;
    if (conn->seek_func == (curl_seek_callback)0x0) {
      iVar4 = 0;
    }
    else {
      Curl_set_in_callback(data,true);
      iVar4 = (*conn->seek_func)(conn->seek_client,(data->state).resume_from,0);
      Curl_set_in_callback(data,false);
    }
    if (iVar4 != 0) {
      if (iVar4 != 2) {
        pcVar10 = "Could not seek stream";
LAB_0050606a:
        bVar3 = false;
        Curl_failf(data,pcVar10);
        CVar5 = CURLE_FTP_COULDNT_USE_REST;
        goto LAB_0050607b;
      }
      lVar9 = 0;
      do {
        lVar11 = (data->state).resume_from - lVar9;
        uVar6 = (data->set).buffer_size;
        if (lVar11 <= (long)uVar6) {
          uVar6 = curlx_sotouz(lVar11);
        }
        sVar7 = (*(data->state).fread_func)((data->state).buffer,1,uVar6,(data->state).in);
        if (uVar6 <= sVar7 - 1) {
          pcVar10 = "Failed to read data";
          goto LAB_0050606a;
        }
        lVar9 = lVar9 + sVar7;
      } while (lVar9 < (data->state).resume_from);
    }
    lVar9 = (data->state).infilesize;
    CVar5 = CURLE_FTP_COULDNT_USE_REST;
    bVar3 = true;
    if ((0 < lVar9) &&
       (lVar11 = (data->state).resume_from, lVar8 = lVar9 - lVar11, (data->state).infilesize = lVar8
       , lVar8 == 0 || lVar9 < lVar11)) {
      Curl_infof(data,"File already completely uploaded\n");
      Curl_setup_transfer(data,-1,-1,false,-1);
      *(undefined4 *)((long)pvVar2 + 0x20) = 2;
      (conn->proto).ftpc.state = FTP_STOP;
LAB_00506056:
      bVar3 = false;
      CVar5 = CURLE_OK;
    }
  }
LAB_0050607b:
  if (!bVar3) {
    return CVar5;
  }
LAB_00506080:
  pcVar10 = "APPE %s";
  if ((*(uint *)&(data->set).field_0x878 >> 0xc & 1) == 0) {
    pcVar10 = "STOR %s";
  }
  CVar5 = Curl_pp_sendf(&(conn->proto).ftpc.pp,pcVar10,(conn->proto).ftpc.file);
  if (CVar5 == CURLE_OK) {
    (conn->proto).ftpc.state = FTP_STOR;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

static CURLcode ftp_state_ul_setup(struct connectdata *conn,
                                   bool sizechecked)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((data->state.resume_from && !sizechecked) ||
     ((data->state.resume_from > 0) && sizechecked)) {
    /* we're about to continue the uploading of a file */
    /* 1. get already existing file's size. We use the SIZE command for this
       which may not exist in the server!  The SIZE command is not in
       RFC959. */

    /* 2. This used to set REST. But since we can do append, we
       don't another ftp command. We just skip the source file
       offset and then we APPEND the rest on the file instead */

    /* 3. pass file-size number of bytes in the source file */
    /* 4. lower the infilesize counter */
    /* => transfer as usual */
    int seekerr = CURL_SEEKFUNC_OK;

    if(data->state.resume_from < 0) {
      /* Got no given size to start from, figure it out */
      PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);
      state(conn, FTP_STOR_SIZE);
      return result;
    }

    /* enable append */
    data->set.ftp_append = TRUE;

    /* Let's read off the proper amount of bytes from the input. */
    if(conn->seek_func) {
      Curl_set_in_callback(data, true);
      seekerr = conn->seek_func(conn->seek_client, data->state.resume_from,
                                SEEK_SET);
      Curl_set_in_callback(data, false);
    }

    if(seekerr != CURL_SEEKFUNC_OK) {
      curl_off_t passed = 0;
      if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
        failf(data, "Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      /* seekerr == CURL_SEEKFUNC_CANTSEEK (can't seek to offset) */
      do {
        size_t readthisamountnow =
          (data->state.resume_from - passed > data->set.buffer_size) ?
          (size_t)data->set.buffer_size :
          curlx_sotouz(data->state.resume_from - passed);

        size_t actuallyread =
          data->state.fread_func(data->state.buffer, 1, readthisamountnow,
                                 data->state.in);

        passed += actuallyread;
        if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
          /* this checks for greater-than only to make sure that the
             CURL_READFUNC_ABORT return code still aborts */
          failf(data, "Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while(passed < data->state.resume_from);
    }
    /* now, decrease the size of the read */
    if(data->state.infilesize>0) {
      data->state.infilesize -= data->state.resume_from;

      if(data->state.infilesize <= 0) {
        infof(data, "File already completely uploaded\n");

        /* no data to transfer */
        Curl_setup_transfer(data, -1, -1, FALSE, -1);

        /* Set ->transfer so that we won't get any error in
         * ftp_done() because we didn't transfer anything! */
        ftp->transfer = FTPTRANSFER_NONE;

        state(conn, FTP_STOP);
        return CURLE_OK;
      }
    }
    /* we've passed, proceed as normal */
  } /* resume_from */

  PPSENDF(&ftpc->pp, data->set.ftp_append?"APPE %s":"STOR %s",
          ftpc->file);

  state(conn, FTP_STOR);

  return result;
}